

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  TRef TVar4;
  long lVar5;
  int32_t k;
  char cVar6;
  TRef TVar7;
  ulong uVar8;
  double dVar9;
  GCproto *pGVar10;
  uint uVar11;
  GCproto *pGVar12;
  GCproto *pGVar13;
  
  pGVar12 = J->pt + 1;
  pGVar13 = (GCproto *)endpc;
  TVar4 = slot;
  do {
    pGVar10 = (GCproto *)((long)&pGVar13[-1].varinfo.ptr64 + 4);
    if (pGVar10 <= pGVar12) {
      return 0;
    }
    uVar1 = (uint)(pGVar10->nextgc).gcptr64;
    uVar11 = uVar1 & 0xff;
    TVar7 = 1;
    if ((lj_bc_mode[uVar11] & 7) == 1) {
      if ((uVar1 >> 8 & 0xff) != slot) goto LAB_00153681;
      cVar6 = '\0';
      TVar4 = 0;
      if (uVar11 - 0x29 < 2) {
        pGVar10 = (GCproto *)((long)&pGVar13[-1].varinfo.ptr64 + 4);
        if (pGVar12 < pGVar10) {
          lVar5 = -0x20004;
          do {
            uVar2 = (uint)(pGVar10->nextgc).gcptr64;
            if (((char)uVar2 == 'X') &&
               (uVar8 = (ulong)(uVar2 >> 0xe & 0x3fffc), TVar7 = 0, TVar4 = TVar7,
               (BCIns *)((long)pGVar10 + (uVar8 - 0x1fffc)) <= endpc && -8 < (long)(lVar5 + uVar8)))
            goto LAB_00153681;
            pGVar10 = (GCproto *)((long)&pGVar10[-1].varinfo.ptr64 + 4);
            lVar5 = lVar5 + -4;
          } while (pGVar12 < pGVar10);
        }
        if (uVar11 == 0x29) {
          k = (int)uVar1 >> 0x10;
          if (t == IRT_INT) {
LAB_00153650:
            TVar4 = lj_ir_kint(J,k);
          }
          else {
            dVar9 = (double)k;
LAB_0015366c:
            TVar4 = lj_ir_knum_u64(J,(uint64_t)dVar9);
          }
          cVar6 = '\0';
        }
        else {
          uVar3 = (J->pt->k).ptr64;
          if (t != IRT_INT) {
            dVar9 = *(double *)(uVar3 + (ulong)(uVar1 >> 0x10) * 8);
            goto LAB_0015366c;
          }
          dVar9 = *(double *)(uVar3 + (ulong)(uVar1 >> 0x10) * 8);
          if ((dVar9 == (double)(int)dVar9) && (!NAN(dVar9) && !NAN((double)(int)dVar9))) {
            k = (int32_t)dVar9;
            goto LAB_00153650;
          }
          cVar6 = '\0';
          TVar4 = 0;
        }
      }
    }
    else {
      if (((lj_bc_mode[uVar11] & 7) == 2) && ((uVar1 >> 8 & 0xff) <= slot)) {
        cVar6 = '\0';
        TVar4 = 0;
        goto LAB_00153683;
      }
LAB_00153681:
      cVar6 = (char)TVar7;
    }
LAB_00153683:
    pGVar13 = pGVar10;
    if (cVar6 == '\0') {
      return TVar4;
    }
  } while( true );
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}